

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::write_hash_request(bt_peer_connection *this,hash_request *req)

{
  bool bVar1;
  span<const_char> buf_00;
  char *ptr;
  shared_ptr<libtorrent::aux::torrent> t;
  sha256_hash root;
  char buf [53];
  
  ptr = buf;
  write_impl<unsigned_int,int,char*>(0x31,&ptr);
  *ptr = '\x15';
  ptr = ptr + 1;
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&root,
             &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&root);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(root.m_number._M_elems + 2));
  if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    file_storage::root(&root,&(((t.
                                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_files,(file_index_t)(req->file).m_val);
    ptr = ::std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_char_const*,char*>((uchar *)&root,(uchar *)buf,ptr);
    write_impl<unsigned_int,int,char*>(req->base,&ptr);
    write_impl<unsigned_int,int,char*>(req->index,&ptr);
    write_impl<unsigned_int,int,char*>(req->count,&ptr);
    write_impl<unsigned_int,int,char*>(req->proof_layers,&ptr);
    counters::inc_stats_counter((this->super_peer_connection).m_counters,0x68,1);
    ::std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
    push_back(&this->m_hash_requests,req);
    bVar1 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
    if (bVar1) {
      peer_connection::peer_log
                (&this->super_peer_connection,outgoing_message,"HASH_REQUEST",
                 "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)(req->file).m_val,
                 (ulong)(uint)req->base,(ulong)(uint)req->index,(ulong)(uint)req->count,
                 (ulong)(uint)req->proof_layers);
    }
    buf_00.m_len = 0x35;
    buf_00.m_ptr = buf;
    peer_connection::send_buffer(&this->super_peer_connection,buf_00);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void bt_peer_connection::write_hash_request(hash_request const& req)
	{
		INVARIANT_CHECK;

		char buf[5 + sha256_hash::size() + 4 * 4];
		char* ptr = buf;
		aux::write_uint32(int(sizeof(buf) - 4), ptr);
		aux::write_uint8(msg_hash_request, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto const root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		TORRENT_ASSERT(validate_hash_request(req, t->torrent_file().files()));

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hash_request);

		m_hash_requests.push_back(req);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, int(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}